

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O3

void cs::process_context::cleanup_context(void)

{
  long lVar1;
  long *plVar2;
  
  lVar1 = *(long *)(current_process + 0x88);
  if (lVar1 != *(long *)(current_process + 0x80)) {
    do {
      plVar2 = (long *)(current_process + 0x88);
      cs_impl::any::recycle((any *)(lVar1 + -8));
      *plVar2 = *plVar2 + -8;
      lVar1 = *(long *)(current_process + 0x88);
    } while (lVar1 != *(long *)(current_process + 0x80));
  }
  return;
}

Assistant:

void process_context::cleanup_context()
	{
		while (!current_process->stack.empty())
			current_process->stack.pop_no_return();
#ifdef CS_DEBUGGER
		while(!current_process->stack_backtrace.empty())
			current_process->stack_backtrace.pop_no_return();
#endif
	}